

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::anon_unknown_1::CoordFragmentShader::shadeFragments
          (CoordFragmentShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  FragmentPacket *packet;
  Vec4 vtxColor3;
  Vec4 vtxColor2;
  Vec4 vtxColor1;
  Vec4 vtxColor0;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (0 < numPackets) {
    lVar7 = 0;
    do {
      rr::readVarying<float>((rr *)&local_48,packets,context,0,0);
      rr::readVarying<float>((rr *)&local_58,packets,context,0,1);
      rr::readVarying<float>((rr *)&local_68,packets,context,0,2);
      rr::readVarying<float>((rr *)&local_78,packets,context,0,3);
      pGVar1 = context->outputArray;
      iVar3 = context->numFragmentOutputs;
      iVar2 = (int)lVar7;
      iVar4 = (iVar2 + 1) * iVar3;
      iVar5 = (iVar2 + 2) * iVar3;
      iVar6 = (iVar2 + 3) * iVar3;
      iVar3 = iVar3 * iVar2;
      *(ulong *)&pGVar1[iVar3].v = CONCAT44(fStack_44 * fStack_3c,fStack_3c * local_48);
      pGVar1[iVar3].v.fData[2] = fStack_40 * fStack_3c;
      pGVar1[iVar3].v.uData[3] = 0x3f800000;
      *(ulong *)&pGVar1[iVar4].v = CONCAT44(fStack_54 * fStack_4c,fStack_4c * local_58);
      pGVar1[iVar4].v.fData[2] = fStack_50 * fStack_4c;
      pGVar1[iVar4].v.uData[3] = 0x3f800000;
      *(ulong *)&pGVar1[iVar5].v = CONCAT44(fStack_64 * fStack_5c,fStack_5c * local_68);
      pGVar1[iVar5].v.fData[2] = fStack_60 * fStack_5c;
      pGVar1[iVar5].v.uData[3] = 0x3f800000;
      *(ulong *)&pGVar1[iVar6].v = CONCAT44(fStack_74 * fStack_6c,fStack_6c * local_78);
      pGVar1[iVar6].v.fData[2] = fStack_70 * fStack_6c;
      pGVar1[iVar6].v.uData[3] = 0x3f800000;
      packets = packets + 1;
      lVar7 = lVar7 + 4;
    } while ((ulong)(uint)numPackets << 2 != lVar7);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			rr::FragmentPacket&	packet		= packets[packetNdx];

			const tcu::Vec4		vtxColor0	= rr::readVarying<float>(packet, context, 0, 0);
			const tcu::Vec4		vtxColor1	= rr::readVarying<float>(packet, context, 0, 1);
			const tcu::Vec4		vtxColor2	= rr::readVarying<float>(packet, context, 0, 2);
			const tcu::Vec4		vtxColor3	= rr::readVarying<float>(packet, context, 0, 3);

			const tcu::Vec4		color0		= vtxColor0;
			const tcu::Vec4		color1		= vtxColor1;
			const tcu::Vec4		color2		= vtxColor2;
			const tcu::Vec4		color3		= vtxColor3;

			rr::writeFragmentOutput(context, packetNdx, 0, 0, tcu::Vec4(color0.x() * color0.w(), color0.y() * color0.w(), color0.z() * color0.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 1, 0, tcu::Vec4(color1.x() * color1.w(), color1.y() * color1.w(), color1.z() * color1.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 2, 0, tcu::Vec4(color2.x() * color2.w(), color2.y() * color2.w(), color2.z() * color2.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 3, 0, tcu::Vec4(color3.x() * color3.w(), color3.y() * color3.w(), color3.z() * color3.w(), 1.0f));
		}
	}